

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

wchar_t el_wparse(EditLine *el,wchar_t argc,wchar_t **argv)

{
  wchar_t wVar1;
  int iVar2;
  wchar_t *pwVar3;
  wchar_t *__dest;
  long lVar4;
  anon_struct_16_2_3f885e32 *paVar5;
  long lVar6;
  wchar_t *__wcs;
  bool bVar7;
  
  if (argc < L'\x01') {
LAB_0010d17d:
    wVar1 = L'\xffffffff';
  }
  else {
    __wcs = *argv;
    pwVar3 = wcschr(__wcs,L':');
    if (pwVar3 != (wchar_t *)0x0) {
      lVar6 = (long)pwVar3 - (long)__wcs;
      if (lVar6 == 0) {
        bVar7 = false;
      }
      else {
        __dest = (wchar_t *)calloc((lVar6 >> 2) + 1,4);
        if (__dest == (wchar_t *)0x0) {
          bVar7 = false;
        }
        else {
          wcsncpy(__dest,__wcs,lVar6 >> 2);
          *(undefined4 *)((long)__dest + lVar6) = 0;
          pwVar3 = pwVar3 + 1;
          wVar1 = el_match(el->el_prog,__dest);
          free(__dest);
          bVar7 = wVar1 != L'\0';
        }
      }
      __wcs = pwVar3;
      if (!bVar7) {
        return L'\0';
      }
    }
    iVar2 = wcscmp(anon_var_dwarf_bc1,__wcs);
    if (iVar2 == 0) {
      paVar5 = cmds;
    }
    else {
      lVar6 = 0;
      do {
        lVar4 = lVar6;
        if (lVar4 + 0x10 == 0x70) goto LAB_0010d17d;
        iVar2 = wcscmp(*(wchar_t **)((long)&cmds[1].name + lVar4),__wcs);
        lVar6 = lVar4 + 0x10;
      } while (iVar2 != 0);
      paVar5 = (anon_struct_16_2_3f885e32 *)(lVar4 + 0x1274e0);
    }
    wVar1 = (*paVar5->func)(el,argc,argv);
    wVar1 = -wVar1;
  }
  return wVar1;
}

Assistant:

int
el_wparse(EditLine *el, int argc, const wchar_t *argv[])
{
	const wchar_t *ptr;
	int i;

	if (argc < 1)
		return -1;
	ptr = wcschr(argv[0], L':');
	if (ptr != NULL) {
		wchar_t *tprog;
		size_t l;

		if (ptr == argv[0])
			return 0;
		l = (size_t)(ptr - argv[0]);
		tprog = el_calloc(l + 1, sizeof(*tprog));
		if (tprog == NULL)
			return 0;
		(void) wcsncpy(tprog, argv[0], l);
		tprog[l] = '\0';
		ptr++;
		l = (size_t)el_match(el->el_prog, tprog);
		el_free(tprog);
		if (!l)
			return 0;
	} else
		ptr = argv[0];

	for (i = 0; cmds[i].name != NULL; i++)
		if (wcscmp(cmds[i].name, ptr) == 0) {
			i = (*cmds[i].func) (el, argc, argv);
			return -i;
		}
	return -1;
}